

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpt.c
# Opt level: O2

uint jpt_read_VBAS_info(opj_cio_t *cio,uint value)

{
  uint uVar1;
  
  do {
    uVar1 = cio_read(cio,1);
    value = uVar1 & 0x7f | value << 7;
  } while ((char)uVar1 < '\0');
  return value;
}

Assistant:

unsigned int jpt_read_VBAS_info(opj_cio_t *cio, unsigned int value) {
	unsigned char elmt;

	elmt = cio_read(cio, 1);
	while ((elmt >> 7) == 1) {
		value = (value << 7);
		value |= (elmt & 0x7f);
		elmt = cio_read(cio, 1);
	}
	value = (value << 7);
	value |= (elmt & 0x7f);

	return value;
}